

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi-seq2.c
# Opt level: O3

uint64_t pi_mc(long start,long cnt)

{
  int iVar1;
  uint64_t uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  if (cnt == 1) {
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    do {
      uVar2 = pi_mc(start,cnt / 2);
      start = start + cnt / 2;
      lVar4 = lVar4 + uVar2;
      uVar5 = cnt - 1;
      cnt = (cnt - (cnt + 1 >> 0x3f)) + 1 >> 1;
    } while (1 < uVar5);
  }
  uVar3 = (seed * 0x41c64e6d + 0x3039) / 0x7fffffff;
  dVar6 = (double)(int)(seed * 0x41c64e6d + (uVar3 << 0x1f | uVar3) + 0x3039) / 2147483647.0;
  iVar1 = seed * -0x3d5d6597;
  seed = iVar1 + 0xd3dc167e;
  uVar3 = seed / 0x7fffffff;
  dVar7 = (double)(int)(iVar1 + (uVar3 << 0x1f | uVar3) + -0x2c23e982) / 2147483647.0;
  return (ulong)(SQRT(dVar6 * dVar6 + dVar7 * dVar7) < 1.0) + lVar4;
}

Assistant:

uint64_t pi_mc(long start, long cnt)
{
    if (cnt == 1) {
        double x = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        double y = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        return sqrt(x*x+y*y) < 1.0 ? 1 : 0;
    }
    return pi_mc(start, cnt/2) + pi_mc(start+cnt/2, (cnt+1)/2);
}